

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::listen_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,listen_failed_alert *this)

{
  undefined8 uVar1;
  error_category *peVar2;
  _Alloc_hider _Var3;
  char *pcVar4;
  size_t sVar5;
  int in_ECX;
  char *pcVar6;
  string local_1c8;
  string local_1a8;
  string local_188;
  char ret [300];
  
  print_endpoint_abi_cxx11_
            (&local_1a8,(libtorrent *)&this->address,(address *)(ulong)(uint)this->port,in_ECX);
  _Var3._M_p = local_1a8._M_dataplus._M_p;
  pcVar4 = aux::stack_allocator::ptr
                     ((this->m_alloc)._M_data,(allocation_slot)(this->m_interface_idx).m_idx);
  if ((ulong)this->op < 0x2b) {
    pcVar6 = operation_name::names[this->op];
  }
  else {
    pcVar6 = "unknown operation";
  }
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::sock_type_str(libtorrent::socket_type_t)::type_str +
           (ulong)this->socket_type * 8);
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&local_1c8,peVar2,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_188,&local_1c8);
  snprintf(ret,300,"listening on %s (device: %s) failed: [%s] [%s] %s",_Var3._M_p,pcVar4,pcVar6,
           uVar1,local_188._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(ret);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,ret,ret + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string listen_failed_alert::message() const
	{
		char ret[300];
		std::snprintf(ret, sizeof(ret), "listening on %s (device: %s) failed: [%s] [%s] %s"
			, print_endpoint(address, port).c_str()
			, listen_interface()
			, operation_name(op)
			, sock_type_str(socket_type)
			, convert_from_native(error.message()).c_str());
		return ret;
	}